

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

bool __thiscall PDA::Transducer::StoreFst::rollback(StoreFst *this)

{
  int iVar1;
  bool bVar2;
  Settings *this_00;
  wostream *pwVar3;
  reference pvVar4;
  vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_> *this_01;
  reference pvVar5;
  size_type sVar6;
  allocator<wchar_t> local_39;
  wstring local_38 [36];
  int local_14;
  StoreFst *local_10;
  StoreFst *this_local;
  
  local_10 = this;
  this_00 = Utils::Settings::Instance();
  bVar2 = Utils::Settings::isSyntaxTraceEnabled(this_00);
  if (bVar2) {
    local_14 = (int)std::setw(10);
    pwVar3 = std::operator<<((wostream *)&std::wcout,(_Setw)local_14);
    pwVar3 = std::operator<<(pwVar3,L"Rollback");
    std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
  }
  if ((this->m_mostState).m_sourcePosition <= (this->m_currentState).m_sourcePosition) {
    State::operator=(&this->m_mostState,&this->m_currentState);
  }
  do {
    bVar2 = std::
            stack<PDA::Transducer::StoreFst::State,_std::deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>_>
            ::empty(&this->m_states);
    if (bVar2) {
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_38,L"Stack empty",&local_39);
      raise(this,(int)local_38);
    }
    pvVar4 = std::
             stack<PDA::Transducer::StoreFst::State,_std::deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>_>
             ::top(&this->m_states);
    State::operator=(&this->m_currentState,pvVar4);
    std::
    stack<PDA::Transducer::StoreFst::State,_std::deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>_>
    ::pop(&this->m_states);
    (this->m_currentState).m_chainIndex = (this->m_currentState).m_chainIndex + 1;
    iVar1 = (this->m_currentState).m_chainIndex;
    this_01 = Grammar::rules(&this->m_grammar);
    pvVar5 = std::
             vector<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
             ::operator[](this_01,(long)(this->m_currentState).m_ruleIndex);
    sVar6 = std::
            vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
            ::size(&pvVar5->m_chains);
  } while ((int)sVar6 <= iVar1);
  return true;
}

Assistant:

bool rollback()
    {
        if (Utils::Settings::Instance().isSyntaxTraceEnabled())
            std::wcout << std::setw(10) << L"Rollback" << std::endl;
        if (m_currentState.m_sourcePosition >= m_mostState.m_sourcePosition)
            m_mostState = m_currentState;
        do
        {
            if (m_states.empty())
                raise(L"Stack empty");
            m_currentState = m_states.top();
            m_states.pop();
            ++m_currentState.m_chainIndex;
        } while (m_currentState.m_chainIndex >= static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size()));
        return true;
    }